

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

VkDescriptorSet __thiscall
Diligent::DynamicDescriptorSetAllocator::Allocate
          (DynamicDescriptorSetAllocator *this,VkDescriptorSetLayout SetLayout,char *DebugName)

{
  VulkanLogicalDevice *pVVar1;
  bool bVar2;
  RenderDeviceVkImpl *this_00;
  reference pvVar3;
  VkDescriptorPool_T *pVVar4;
  DescriptorPoolWrapper local_48;
  VulkanLogicalDevice *local_30;
  VulkanLogicalDevice *LogicalDevice;
  VkDescriptorSet set;
  char *DebugName_local;
  VkDescriptorSetLayout SetLayout_local;
  DynamicDescriptorSetAllocator *this_local;
  
  LogicalDevice = (VulkanLogicalDevice *)0x0;
  set = (VkDescriptorSet)DebugName;
  DebugName_local = (char *)SetLayout;
  SetLayout_local = (VkDescriptorSetLayout)this;
  this_00 = DescriptorPoolManager::GetDeviceVkImpl(this->m_GlobalPoolMgr);
  local_30 = RenderDeviceVkImpl::GetLogicalDevice(this_00);
  bVar2 = std::
          vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
          ::empty(&this->m_AllocatedPools);
  pVVar1 = local_30;
  if (!bVar2) {
    pvVar3 = std::
             vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
             ::back(&this->m_AllocatedPools);
    pVVar4 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDescriptorPool_T_
                       ((VulkanObjectWrapper *)pvVar3);
    LogicalDevice =
         (VulkanLogicalDevice *)
         AllocateDescriptorSet(pVVar1,pVVar4,(VkDescriptorSetLayout)DebugName_local,(char *)set);
  }
  if (LogicalDevice == (VulkanLogicalDevice *)0x0) {
    DescriptorPoolManager::GetPool(&local_48,this->m_GlobalPoolMgr,"Dynamic Descriptor Pool");
    std::
    vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
    ::
    emplace_back<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
              ((vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
                *)&this->m_AllocatedPools,&local_48);
    VulkanUtilities::
    VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
    ~VulkanObjectWrapper(&local_48);
    pVVar1 = local_30;
    pvVar3 = std::
             vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
             ::back(&this->m_AllocatedPools);
    pVVar4 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDescriptorPool_T_
                       ((VulkanObjectWrapper *)pvVar3);
    LogicalDevice =
         (VulkanLogicalDevice *)
         AllocateDescriptorSet(pVVar1,pVVar4,(VkDescriptorSetLayout)DebugName_local,(char *)set);
  }
  return (VkDescriptorSet)LogicalDevice;
}

Assistant:

VkDescriptorSet DynamicDescriptorSetAllocator::Allocate(VkDescriptorSetLayout SetLayout, const char* DebugName)
{
    VkDescriptorSet                             set           = VK_NULL_HANDLE;
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_GlobalPoolMgr.GetDeviceVkImpl().GetLogicalDevice();
    if (!m_AllocatedPools.empty())
    {
        set = AllocateDescriptorSet(LogicalDevice, m_AllocatedPools.back(), SetLayout, DebugName);
    }

    if (set == VK_NULL_HANDLE)
    {
        m_AllocatedPools.emplace_back(m_GlobalPoolMgr.GetPool("Dynamic Descriptor Pool"));
        set = AllocateDescriptorSet(LogicalDevice, m_AllocatedPools.back(), SetLayout, DebugName);
    }

    return set;
}